

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

parser_error parse_player_timed_end_message(parser *p)

{
  long *plVar1;
  char *s2;
  char *pcVar2;
  timed_effect_parse_state *ps;
  parser *p_local;
  
  plVar1 = (long *)parser_priv(p);
  if (plVar1 != (long *)0x0) {
    if (*plVar1 == 0) {
      p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      pcVar2 = *(char **)(*plVar1 + 0x18);
      s2 = parser_getstr(p,"text");
      pcVar2 = string_append(pcVar2,s2);
      *(char **)(*plVar1 + 0x18) = pcVar2;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    return p_local._4_4_;
  }
  __assert_fail("ps",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                ,0x83,"enum parser_error parse_player_timed_end_message(struct parser *)");
}

Assistant:

static enum parser_error parse_player_timed_end_message(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	ps->t->on_end = string_append(ps->t->on_end, parser_getstr(p, "text"));
	return PARSE_ERROR_NONE;
}